

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_simple_key<std::vector<char,std::allocator<char>>>
          (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  undefined1 *puVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *loc_01;
  detail *pdVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  *ctx;
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_1f2;
  allocator<char> local_1f1;
  string local_1f0;
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bstr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  location<std::vector<char,_std::allocator<char>_>_> *local_138;
  value_type reg;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> bare
  ;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  local_80;
  
  pdVar5 = this;
  parse_basic_string<std::vector<char,std::allocator<char>>>(&bstr,this,loc);
  if (bstr.is_ok_ == true) {
    pvVar2 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&bstr);
    pvVar3 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&bstr);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)&bare,&(pvVar2->first).str,&pvVar3->second);
  }
  else {
    result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&bstr,(EVP_PKEY_CTX *)pdVar5);
    pdVar5 = this;
    parse_literal_string<std::vector<char,std::allocator<char>>>(&bstr,this,loc_00);
    if (bstr.is_ok_ != true) {
      result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&bstr,(EVP_PKEY_CTX *)pdVar5);
      pdVar5 = this;
      repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
      ::invoke<std::vector<char,std::allocator<char>>>
                (&bare,(repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
                        *)this,loc_01);
      if (bare.is_ok_ == true) {
        pvVar4 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 ::unwrap(&bare);
        region<std::vector<char,_std::allocator<char>_>_>::region(&reg,pvVar4);
        region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_(&local_1f0,&reg);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_80,&local_1f0,&reg);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)&bstr,&local_80);
        ctx_00 = &bstr;
        result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,(success_type *)&bstr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                 *)&bstr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::~pair(&local_80);
        std::__cxx11::string::~string((string *)&local_1f0);
        region<std::vector<char,_std::allocator<char>_>_>::~region(&reg);
        result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
        ::cleanup(&bare,(EVP_PKEY_CTX *)ctx_00);
        return __return_storage_ptr__;
      }
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::cleanup(&bare,(EVP_PKEY_CTX *)pdVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reg,"[error] toml::parse_simple_key: ",&local_1f1);
      local_138 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[35],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&bstr,&local_138,(char (*) [35])"the next token is not a simple key");
      __l._M_len = 1;
      __l._M_array = (iterator)&bstr;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_1f0,__l,&local_1f2);
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)&bare,(string *)&reg,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_1f0,&local_158);
      local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
      puVar1 = (undefined1 *)((long)&bare.field_1 + 8);
      if ((undefined1 *)bare._0_8_ == puVar1) {
        local_80.first.field_2._8_8_ =
             bare.field_1.succ.value.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      }
      else {
        local_80.first._M_dataplus._M_p = (pointer)bare._0_8_;
      }
      local_80.first._M_string_length =
           (size_type)bare.field_1.succ.value.super_region_base._vptr_region_base;
      bare.field_1.succ.value.super_region_base._vptr_region_base = (region_base)(_func_int **)0x0;
      bare.field_1._8_1_ = 0;
      bare._0_8_ = puVar1;
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&bare);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1f0);
      std::__cxx11::string::~string((string *)&bstr.field_1.succ);
      std::__cxx11::string::~string((string *)&reg);
      return __return_storage_ptr__;
    }
    pvVar2 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&bstr);
    pvVar3 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&bstr);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)&bare,&(pvVar2->first).str,&pvVar3->second);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  ::pair(&local_80,
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
          *)&bare);
  ctx = &local_80;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(success_type *)&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  ::~pair(&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
           *)&bare);
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup(&bstr,(EVP_PKEY_CTX *)ctx);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<key, region<Container>>, std::string>
parse_simple_key(location<Container>& loc)
{
    if(const auto bstr = parse_basic_string(loc))
    {
        return ok(std::make_pair(bstr.unwrap().first.str, bstr.unwrap().second));
    }
    if(const auto lstr = parse_literal_string(loc))
    {
        return ok(std::make_pair(lstr.unwrap().first.str, lstr.unwrap().second));
    }
    if(const auto bare = lex_unquoted_key::invoke(loc))
    {
        const auto reg = bare.unwrap();
        return ok(std::make_pair(reg.str(), reg));
    }
    return err(format_underline("[error] toml::parse_simple_key: ",
            {{std::addressof(loc), "the next token is not a simple key"}}));
}